

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<signed_char,_long_double>::Run
          (DataTransform<signed_char,_long_double> *this,istream *input_stream)

{
  longdouble lVar1;
  NumericType NVar2;
  WarningType WVar3;
  char *__nptr;
  bool bVar4;
  int *piVar5;
  undefined8 uVar6;
  ulong uVar7;
  ostream *poVar8;
  size_t sVar9;
  int iVar10;
  int iVar11;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble lVar12;
  longdouble lVar13;
  longdouble lVar14;
  longdouble lVar15;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  char input_data;
  string word;
  char buffer [128];
  char local_2b1 [11];
  ushort local_2a6;
  ushort local_2a4;
  ushort local_2a2;
  ushort local_2a0;
  ushort local_29e;
  short local_29c;
  short local_29a;
  string local_298;
  string *local_278;
  double local_270;
  double local_268;
  long local_260;
  long local_258;
  ulong local_250;
  ulong local_248;
  longdouble local_23c;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_278 = &this->print_format_;
  iVar11 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(input_stream,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        iVar10 = 2;
        bVar4 = false;
      }
      else {
        piVar5 = __errno_location();
        iVar10 = *piVar5;
        *piVar5 = 0;
        strtold(__nptr,(char **)&local_298);
        if (local_298._M_dataplus._M_p == __nptr) {
          uVar6 = std::__throw_invalid_argument("stold");
LAB_00117766:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar6);
        }
        if (*piVar5 == 0) {
          *piVar5 = iVar10;
        }
        else if (*piVar5 == 0x22) {
          uVar6 = std::__throw_out_of_range("stold");
          goto LAB_00117766;
        }
        local_29e = in_FPUControlWord | 0xc00;
        local_29a = (short)ROUND(in_ST0);
        local_2b1[0] = (char)local_29a;
        iVar10 = 0;
        bVar4 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
    }
    else {
      bVar4 = sptk::ReadStream<signed_char>(local_2b1,input_stream);
      iVar10 = 2;
    }
    if (bVar4 != false) {
      uVar7 = (ulong)local_2b1[0];
      local_29c = (short)local_2b1[0];
      lVar12 = (longdouble)local_29c;
      lVar13 = this->minimum_value_;
      lVar1 = this->maximum_value_;
      if (lVar1 <= lVar13) {
LAB_00117405:
        bVar4 = false;
        lVar13 = lVar12;
      }
      else {
        NVar2 = this->input_numeric_type_;
        if (NVar2 == kFloatingPoint) {
          bVar4 = true;
          if ((lVar13 <= lVar12) && (lVar13 = lVar1, lVar12 <= lVar1)) goto LAB_00117405;
        }
        else if (NVar2 == kUnsignedInteger) {
          lVar14 = (longdouble)9.223372e+18;
          lVar15 = (longdouble)0;
          if (lVar14 <= lVar13) {
            lVar15 = lVar14;
          }
          local_2a4 = in_FPUControlWord | 0xc00;
          local_248 = (ulong)ROUND(lVar13 - lVar15);
          bVar4 = true;
          in_ST3 = in_ST2;
          in_ST4 = in_ST2;
          if (((ulong)(lVar14 <= lVar13) << 0x3f ^ local_248) <= uVar7) {
            lVar15 = (longdouble)9.223372e+18;
            lVar13 = (longdouble)0;
            if (lVar15 <= lVar1) {
              lVar13 = lVar15;
            }
            local_2a6 = in_FPUControlWord | 0xc00;
            local_250 = (ulong)ROUND(lVar1 - lVar13);
            bVar4 = ((ulong)(lVar15 <= lVar1) << 0x3f ^ local_250) < uVar7;
            lVar13 = lVar12;
            if (bVar4) {
              lVar13 = lVar1;
            }
          }
        }
        else {
          if (NVar2 != kSignedInteger) goto LAB_00117405;
          local_2a0 = in_FPUControlWord | 0xc00;
          local_258 = (long)ROUND(lVar13);
          bVar4 = true;
          in_ST4 = in_ST3;
          if (local_258 <= (long)uVar7) {
            local_2a2 = in_FPUControlWord | 0xc00;
            local_260 = (long)ROUND(lVar1);
            bVar4 = local_260 < (long)uVar7;
            lVar13 = lVar12;
            if (bVar4) {
              lVar13 = lVar1;
            }
          }
        }
      }
      if ((!bVar4) && (this->rounding_ != false)) {
        if (local_2b1[0] < '\x01') {
          local_268 = (double)(int)local_2b1[0] + -0.5;
          lVar13 = (longdouble)local_268;
        }
        else {
          local_270 = (double)(int)local_2b1[0] + 0.5;
          lVar13 = (longdouble)local_270;
        }
      }
      in_ST5 = in_ST4;
      in_ST6 = in_ST4;
      if ((bool)(bVar4 & this->warning_type_ != kIgnore)) {
        local_23c = lVar13;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar11);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"th data is over the range of output type",0x28);
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"x2x","");
        sptk::PrintErrorMessage(&local_298,(ostringstream *)&local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p);
        }
        WVar3 = this->warning_type_;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
        std::ios_base::~ios_base(local_1c0);
        iVar10 = 1;
        lVar13 = local_23c;
        if (WVar3 == kExit) goto LAB_001176a1;
      }
      if (this->is_ascii_output_ == true) {
        bVar4 = sptk::SnPrintf<long_double>(lVar13,local_278,0x80,local_b8);
        iVar10 = 1;
        if (bVar4) {
          sVar9 = strlen(local_b8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar9);
          if ((iVar11 + 1) % this->num_column_ == 0) {
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
            std::ostream::put(-0x78);
            std::ostream::flush();
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
          }
LAB_0011769b:
          iVar10 = 0;
        }
      }
      else {
        bVar4 = sptk::WriteStream<long_double>(lVar13,(ostream *)&std::cout);
        iVar10 = 1;
        if (bVar4) goto LAB_0011769b;
      }
    }
LAB_001176a1:
    if (iVar10 != 0) {
      if (iVar10 == 2) {
        bVar4 = true;
        if ((this->is_ascii_output_ == true) && (iVar11 % this->num_column_ != 0)) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
      }
      else {
        bVar4 = false;
      }
      return bVar4;
    }
    iVar11 = iVar11 + 1;
    in_ST7 = in_ST6;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }